

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

size_t __thiscall
MADPComponentDiscreteActions::GetNrActions(MADPComponentDiscreteActions *this,Index agentI)

{
  pointer puVar1;
  ostream *poVar2;
  E *this_00;
  stringstream ss;
  ostream local_188 [376];
  
  puVar1 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)agentI <
      (ulong)((long)(this->_m_nrActions).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return puVar1[agentI];
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_188,
                           "Warning: MADPComponentDiscreteActions::GetNrActions(Index agentI) - index out of bounds"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrActions(Index agentI) const
{    
    if(agentI < _m_nrActions.size())
        return _m_nrActions[agentI];
    else
    {
        stringstream ss;
            ss << "Warning: MADPComponentDiscreteActions::GetNrActions(Index agentI) - index out of bounds"<<endl;
        throw E(ss);
    }
}